

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O0

int test_json2map_numberInt(void)

{
  int iVar1;
  char *__s2;
  json2map_t *obj;
  json2map_t *json2mapObj;
  keyvalue_t *map;
  char *in_stack_00000018;
  char *in_stack_00000020;
  json2map_t *in_stack_00000028;
  int local_4;
  
  __s2 = (char *)calloc(0x1fe,0xff);
  obj = json2map_init((char)((ulong)__s2 >> 0x38));
  json2map_registerDataHook(obj,__s2,json2map_hookMethod);
  json2map_parse(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  printf("Expected: \t%s\nActual: \t%s\n\n","number",__s2);
  iVar1 = strcmp("number",__s2);
  if (iVar1 == 0) {
    printf("Expected: \t%s\nActual: \t%s\n\n","123456",__s2 + 0xff);
    iVar1 = strcmp("123456",__s2 + 0xff);
    if (iVar1 == 0) {
      json2map_destroy((json2map_t *)0x102e37);
      free(__s2);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int test_json2map_numberInt() {
	keyvalue_t *map = (keyvalue_t *) calloc(sizeof(keyvalue_t), LIST_SIZE);

	json2map_t *json2mapObj = json2map_init(0);
	json2map_registerDataHook(json2mapObj, map, &json2map_hookMethod);
	json2map_parse(json2mapObj, NULL, "{\"number\":123456}");

	ASSERTSTR("number", map[0].key);
	ASSERTSTR("123456", map[0].value);

	json2map_destroy(json2mapObj);
	free(map);
	return 0;
}